

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intceil.hpp
# Opt level: O0

unsigned_long burst::intceil<unsigned_long,int>(Integer<unsigned_long> n,Integer<int> factor)

{
  unsigned_long uVar1;
  domain_error *this;
  Integer<int> factor_local;
  Integer<unsigned_long> n_local;
  
  if (0 < factor) {
    uVar1 = detail::intceil_impl<unsigned_long,int>(n,factor);
    return uVar1;
  }
  this = (domain_error *)__cxa_allocate_exception(0x10);
  std::domain_error::domain_error(this,anon_var_dwarf_2f02ee);
  __cxa_throw(this,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

constexpr I intceil (Integer<I> n, Integer<J> factor)
    {
        if (factor > 0)
        {
            return detail::intceil_impl(n, factor);
        }
        else
        {
            throw std::domain_error("Ближайшее кратное относительно неположительного делителя не определено.");
        }
    }